

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.hpp
# Opt level: O0

void boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::construct
               (PyObject *obj,rvalue_from_python_stage1_data *data)

{
  undefined4 uVar1;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  void *storage;
  CurrentScaling x;
  
  uVar1 = PyLong_AsLong(in_RDI);
  *(undefined4 *)(in_RSI + 2) = uVar1;
  *in_RSI = in_RSI + 2;
  return;
}

Assistant:

void enum_<T>::construct(PyObject* obj, converter::rvalue_from_python_stage1_data* data)
{
#if PY_VERSION_HEX >= 0x03000000
    T x = static_cast<T>(PyLong_AS_LONG(obj));
#else
    T x = static_cast<T>(PyInt_AS_LONG(obj));
#endif
    void* const storage = ((converter::rvalue_from_python_storage<T>*)data)->storage.bytes;
    new (storage) T(x);
    data->convertible = storage;
}